

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNMatrix SUNDenseMatrix(sunindextype M,sunindextype N,SUNContext_conflict sunctx)

{
  SUNMatrix p_Var1;
  long *plVar2;
  void *pvVar3;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  sunindextype j;
  SUNMatrixContent_Dense content;
  SUNMatrix A;
  SUNContext_conflict sunctx_local_scope_;
  long local_38;
  
  p_Var1 = (SUNMatrix)SUNMatNewEmpty(in_RDX);
  p_Var1->ops->getid = SUNMatGetID_Dense;
  p_Var1->ops->clone = SUNMatClone_Dense;
  p_Var1->ops->destroy = SUNMatDestroy_Dense;
  p_Var1->ops->zero = SUNMatZero_Dense;
  p_Var1->ops->copy = SUNMatCopy_Dense;
  p_Var1->ops->scaleadd = SUNMatScaleAdd_Dense;
  p_Var1->ops->scaleaddi = SUNMatScaleAddI_Dense;
  p_Var1->ops->matvec = SUNMatMatvec_Dense;
  p_Var1->ops->mathermitiantransposevec = SUNMatHermitianTransposeVec_Dense;
  p_Var1->ops->space = SUNMatSpace_Dense;
  plVar2 = (long *)malloc(0x28);
  p_Var1->content = plVar2;
  *plVar2 = in_RDI;
  plVar2[1] = in_RSI;
  plVar2[3] = in_RDI * in_RSI;
  plVar2[2] = 0;
  plVar2[4] = 0;
  pvVar3 = calloc(in_RDI * in_RSI,8);
  plVar2[2] = (long)pvVar3;
  pvVar3 = malloc(in_RSI << 3);
  plVar2[4] = (long)pvVar3;
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    *(long *)(plVar2[4] + local_38 * 8) = plVar2[2] + local_38 * in_RDI * 8;
  }
  return p_Var1;
}

Assistant:

SUNMatrix SUNDenseMatrix(sunindextype M, sunindextype N, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNMatrix A;
  SUNMatrixContent_Dense content;
  sunindextype j;

  /* return with NULL matrix on illegal dimension input */
  SUNAssertNull(N > 0 && M > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  A->ops->getid                    = SUNMatGetID_Dense;
  A->ops->clone                    = SUNMatClone_Dense;
  A->ops->destroy                  = SUNMatDestroy_Dense;
  A->ops->zero                     = SUNMatZero_Dense;
  A->ops->copy                     = SUNMatCopy_Dense;
  A->ops->scaleadd                 = SUNMatScaleAdd_Dense;
  A->ops->scaleaddi                = SUNMatScaleAddI_Dense;
  A->ops->matvec                   = SUNMatMatvec_Dense;
  A->ops->mathermitiantransposevec = SUNMatHermitianTransposeVec_Dense;
  A->ops->space                    = SUNMatSpace_Dense;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Dense)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  A->content = content;

  /* Fill content */
  content->M     = M;
  content->N     = N;
  content->ldata = M * N;
  content->data  = NULL;
  content->cols  = NULL;

  /* Allocate content */
  content->data = (sunrealtype*)calloc(M * N, sizeof(sunrealtype));
  SUNAssertNull(content->data, SUN_ERR_MALLOC_FAIL);

  content->cols = (sunrealtype**)malloc(N * sizeof(sunrealtype*));
  SUNAssertNull(content->cols, SUN_ERR_MALLOC_FAIL);
  for (j = 0; j < N; j++) { content->cols[j] = content->data + j * M; }

  return (A);
}